

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeNext(BtCursor *pCur,int flags)

{
  ushort uVar1;
  int iVar2;
  BtCursor *in_RDI;
  MemPage *pPage;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  (in_RDI->info).nSize = 0;
  in_RDI->curFlags = in_RDI->curFlags & 0xf9;
  if (in_RDI->eState == '\0') {
    uVar1 = in_RDI->ix + 1;
    in_RDI->ix = uVar1;
    if (uVar1 < in_RDI->pPage->nCell) {
      if (in_RDI->pPage->leaf == '\0') {
        iVar2 = moveToLeftmost(in_RDI);
      }
      else {
        iVar2 = 0;
      }
    }
    else {
      in_RDI->ix = in_RDI->ix - 1;
      iVar2 = btreeNext((BtCursor *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    }
  }
  else {
    iVar2 = btreeNext((BtCursor *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeNext(BtCursor *pCur, int flags){
  MemPage *pPage;
  UNUSED_PARAMETER( flags );  /* Used in COMDB2 but not native SQLite */
  assert( cursorOwnsBtShared(pCur) );
  assert( flags==0 || flags==1 );
  pCur->info.nSize = 0;
  pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
  if( pCur->eState!=CURSOR_VALID ) return btreeNext(pCur);
  pPage = pCur->pPage;
  if( (++pCur->ix)>=pPage->nCell ){
    pCur->ix--;
    return btreeNext(pCur);
  }
  if( pPage->leaf ){
    return SQLITE_OK;
  }else{
    return moveToLeftmost(pCur);
  }
}